

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_> *
__thiscall
toml::ok<std::tuple<toml::local_time,toml::local_time_format_info,toml::detail::region>>
          (success<std::tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region>_>
           *__return_storage_ptr__,toml *this,
          tuple<toml::local_time,_toml::local_time_format_info,_toml::detail::region> *v)

{
  _Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region> _Stack_98;
  
  std::_Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>::
  _Tuple_impl(&_Stack_98,
              (_Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               *)this);
  std::_Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>::
  _Tuple_impl((_Tuple_impl<0UL,_toml::local_time,_toml::local_time_format_info,_toml::detail::region>
               *)__return_storage_ptr__,&_Stack_98);
  detail::region::~region((region *)&_Stack_98);
  return __return_storage_ptr__;
}

Assistant:

success<typename std::decay<T>::type> ok(T&& v)
{
    return success<typename std::decay<T>::type>(std::forward<T>(v));
}